

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void __thiscall
gnuplotio::PlotGroup::
add<std::vector<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::allocator<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>,gnuplotio::Mode2D>
          (PlotGroup *this,
          vector<std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>,_std::allocator<std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>
          *arg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *plotspec,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_array_record)

{
  int iVar1;
  logic_error *this_00;
  long *plVar2;
  long *plVar3;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)text_array_record);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)text_array_record);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)text_array_record);
      if (iVar1 != 0) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"text_array_record must be one of text, array, or record (was ",
                       text_array_record);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
        local_68 = (long *)*plVar2;
        plVar3 = plVar2 + 2;
        if (local_68 == plVar3) {
          local_58 = *plVar3;
          lStack_50 = plVar2[3];
          local_68 = &local_58;
        }
        else {
          local_58 = *plVar3;
        }
        local_60 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::logic_error::logic_error(this_00,(string *)&local_68);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)text_array_record);
  if (iVar1 == 0) {
    std::vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>>::
    emplace_back<std::vector<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::allocator<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>const&,std::__cxx11::string_const&,char_const(&)[6],gnuplotio::Mode2D,gnuplotio::ModeText>
              ((vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>> *)&this->plots,arg,
               plotspec,(char (*) [6])"array",(Mode2D *)&local_68,(ModeText *)&local_48);
  }
  else {
    std::vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>>::
    emplace_back<std::vector<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::allocator<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,gnuplotio::Mode2D,gnuplotio::ModeBinary>
              ((vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>> *)&this->plots,arg,
               plotspec,text_array_record,(Mode2D *)&local_68,(ModeBinary *)&local_48);
  }
  return;
}

Assistant:

void add(const T &arg, const std::string &plotspec, const std::string &text_array_record, OrganizationMode) {
        if(!(
            text_array_record == "text" ||
            text_array_record == "array" ||
            text_array_record == "record"
        )) throw std::logic_error("text_array_record must be one of text, array, or record (was "+
            text_array_record+")");

        if(text_array_record == "text") {
            plots.emplace_back(arg, plotspec,
                "array", // arbitrary value
                OrganizationMode(), ModeText());
        } else {
            plots.emplace_back(arg, plotspec, text_array_record,
                OrganizationMode(), ModeBinary());
        }
    }